

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabelFileParser.cpp
# Opt level: O1

void __thiscall LabelFileParser::readLabelFile(LabelFileParser *this)

{
  char cVar1;
  istream *piVar2;
  int iVar3;
  string token;
  string str;
  istringstream stream;
  int local_1f4;
  value_type local_1f0;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 5) != 0) {
    std::operator<<((ostream *)&std::cout,"Can\'t open labelfile");
LAB_001195b8:
    exit(1);
  }
  local_1d0 = local_1c0;
  local_1c8 = 0;
  local_1c0[0] = 0;
  local_1f4 = 0;
  do {
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)this + -0x18) + (char)this);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)this,(string *)&local_1d0,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0);
      }
      return;
    }
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_1d0,_S_in);
    if (local_1f4 != 0) {
      iVar3 = 0;
      while( true ) {
        piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b0,(string *)&local_1f0,',');
        if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
        if (iVar3 != 0) {
          if (iVar3 != 1) {
            std::operator<<((ostream *)&std::cout,"Label file must be one dimension.");
            goto LAB_001195b8;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->_label,&local_1f0);
        }
        iVar3 = iVar3 + 1;
      }
    }
    std::__cxx11::istringstream::~istringstream(local_1b0);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    local_1f4 = local_1f4 + 1;
  } while( true );
}

Assistant:

void LabelFileParser::readLabelFile(){//{{{
    if(!_inputText){
        cout<<"Can't open labelfile";
        exit(1);
    }
    string str;
    for(int i=0;getline(_inputText,str);i++){
        string token;
        istringstream stream(str);
        if(i == 0) continue;
        for(int j=0; getline(stream,token,','); j++){
            if(j == 0)continue;
            if(j > 1){
                cout<<"Label file must be one dimension.";
                exit(1);
            }
            _label.push_back(token);
        }
    }
}